

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

void __thiscall
TPZSkylMatrix<std::complex<long_double>_>::SolveSOR
          (TPZSkylMatrix<std::complex<long_double>_> *this,int64_t *numiterations,
          TPZFMatrix<std::complex<long_double>_> *F,TPZFMatrix<std::complex<long_double>_> *result,
          TPZFMatrix<std::complex<long_double>_> *residual,
          TPZFMatrix<std::complex<long_double>_> *scratch,REAL overrelax,REAL *tol,int FromCurrent,
          int direction)

{
  long lVar1;
  double dVar2;
  complex<long_double> **ppcVar3;
  undefined8 uVar4;
  int iVar5;
  undefined4 extraout_var;
  complex<long_double> *pcVar6;
  complex<long_double> *pcVar7;
  complex<long_double> *pcVar8;
  complex<long_double> *pcVar9;
  complex<long_double> *pcVar10;
  long col;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  longdouble *plVar16;
  long lVar17;
  undefined8 *puVar18;
  bool bVar19;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble lVar20;
  longdouble lVar21;
  longdouble in_ST2;
  longdouble lVar22;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  undefined4 uVar23;
  undefined4 uVar24;
  longdouble local_188;
  complex<long_double> val;
  complex<long_double> __r;
  longdouble local_120;
  double local_108;
  complex<long_double> __r_3;
  complex<long_double> over;
  
  if (residual == F) {
    std::operator<<((ostream *)&std::cout,
                    "TPZMatrix::SolveSOR called with residual and F equal, no solution\n");
    return;
  }
  if (residual == (TPZFMatrix<std::complex<long_double>_> *)0x0) {
    dVar2 = *tol + *tol + 1.0;
  }
  else {
    Norm((longdouble *)residual,(TPZFMatrix<std::complex<long_double>_> *)numiterations);
    dVar2 = (double)in_ST0;
    in_ST0 = in_ST1;
    in_ST1 = in_ST2;
    in_ST2 = in_ST3;
    in_ST3 = in_ST4;
    in_ST4 = in_ST5;
    in_ST5 = in_ST6;
  }
  if (FromCurrent == 0) {
    (*(result->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0xf])();
  }
  over._M_value._0_8_ = SUB108((longdouble)overrelax,0);
  over._M_value._8_2_ = SUB102((unkuint10)(longdouble)overrelax >> 0x40,0);
  over._M_value._16_8_ = SUB108((longdouble)0,0);
  over._M_value._24_2_ = SUB102((unkuint10)(longdouble)0 >> 0x40,0);
  iVar5 = (*(this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable
            ._vptr_TPZSavable[0xc])();
  lVar14 = (F->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol;
  lVar12 = 0;
  bVar19 = direction != -1;
  lVar11 = CONCAT44(extraout_var,iVar5);
  if (!bVar19) {
    lVar11 = lVar12;
  }
  lVar1 = (ulong)bVar19 * 2 + -1;
  lVar15 = CONCAT44(extraout_var,iVar5) + -1;
  if (bVar19) {
    lVar15 = lVar12;
  }
  if (lVar14 < 1) {
    lVar14 = lVar12;
  }
  while ((lVar12 < *numiterations && (*tol <= dVar2 && dVar2 != *tol))) {
    TPZFMatrix<std::complex<long_double>_>::operator=(scratch,F);
    uVar23 = 0;
    uVar24 = 0;
    for (col = 0; col != lVar14; col = col + 1) {
      local_108 = (double)CONCAT44(uVar24,uVar23);
      lVar17 = lVar15;
      if (direction == 1) {
        for (; lVar13 = lVar15, lVar17 != lVar11; lVar17 = lVar17 + lVar1) {
          ppcVar3 = (this->fElem).fStore;
          pcVar8 = ppcVar3[lVar17 + 1];
          pcVar9 = ppcVar3[lVar17];
          val._M_value._0_8_ = SUB108((longdouble)0,0);
          val._M_value._8_2_ = SUB102((unkuint10)(longdouble)0 >> 0x40,0);
          pcVar10 = ppcVar3[lVar17];
          val._M_value._16_8_ = val._M_value._0_8_;
          val._M_value._24_2_ = val._M_value._8_2_;
          pcVar6 = TPZFMatrix<std::complex<long_double>_>::operator()
                             (scratch,(lVar17 - ((long)pcVar8 - (long)pcVar9 >> 5)) + 1,col);
          pcVar7 = TPZFMatrix<std::complex<long_double>_>::operator()(result,lVar17,col);
          val._M_value._0_8_ = *(undefined8 *)pcVar7->_M_value;
          val._M_value._16_8_ = *(undefined8 *)(pcVar7->_M_value + 0x10);
          val._M_value._24_2_ = SUB82(*(undefined8 *)(pcVar7->_M_value + 0x18),0);
          val._M_value._26_6_ = SUB86((ulong)*(undefined8 *)(pcVar7->_M_value + 0x18) >> 0x10,0);
          val._M_value._8_2_ = SUB82(*(undefined8 *)(pcVar7->_M_value + 8),0);
          val._M_value._10_6_ = SUB86((ulong)*(undefined8 *)(pcVar7->_M_value + 8) >> 0x10,0);
          puVar18 = (undefined8 *)
                    ((long)(this->fElem).fStore[lVar17] + ((long)pcVar8 - (long)pcVar9) + -0x20);
          lVar13 = (long)puVar18 - (long)pcVar10 >> 5;
          if (lVar13 < 0) {
            lVar13 = -1;
          }
          lVar13 = lVar13 + 1;
          plVar16 = (longdouble *)(pcVar6->_M_value + 0x10);
          while (bVar19 = lVar13 != 0, lVar13 = lVar13 + -1, bVar19) {
            uVar4 = *puVar18;
            __r._M_value._16_8_ = puVar18[2];
            __r._M_value._24_2_ = SUB82(puVar18[3],0);
            __r._M_value._26_6_ = SUB86((ulong)puVar18[3] >> 0x10,0);
            __r._M_value._0_4_ = SUB84(uVar4,0);
            __r._M_value._4_2_ = SUB82((ulong)uVar4 >> 0x20,0);
            __r._M_value._6_2_ = SUB82((ulong)uVar4 >> 0x30,0);
            __r._M_value._8_2_ = SUB82(puVar18[1],0);
            __r._M_value._10_6_ = SUB86((ulong)puVar18[1] >> 0x10,0);
            std::complex<long_double>::operator*=(&__r,&val);
            plVar16[-1] = plVar16[-1] -
                          (longdouble)
                          CONCAT28(__r._M_value._8_2_,
                                   CONCAT26(__r._M_value._6_2_,
                                            CONCAT24(__r._M_value._4_2_,__r._M_value._0_4_)));
            *plVar16 = *plVar16 - (longdouble)CONCAT28(__r._M_value._24_2_,__r._M_value._16_8_);
            puVar18 = puVar18 + -4;
            plVar16 = plVar16 + 2;
            in_ST5 = in_ST4;
          }
        }
        for (; lVar13 != lVar11; lVar13 = lVar13 + lVar1) {
          ppcVar3 = (this->fElem).fStore;
          lVar17 = (long)ppcVar3[lVar13 + 1] - (long)ppcVar3[lVar13];
          pcVar8 = TPZFMatrix<std::complex<long_double>_>::operator()(scratch,lVar13,col);
          val._M_value._0_8_ = *(undefined8 *)pcVar8->_M_value;
          val._M_value._16_8_ = *(undefined8 *)(pcVar8->_M_value + 0x10);
          val._M_value._8_2_ = SUB82(*(undefined8 *)(pcVar8->_M_value + 8),0);
          val._M_value._10_6_ = SUB86((ulong)*(undefined8 *)(pcVar8->_M_value + 8) >> 0x10,0);
          val._M_value._24_2_ = SUB82(*(undefined8 *)(pcVar8->_M_value + 0x18),0);
          val._M_value._26_6_ = SUB86((ulong)*(undefined8 *)(pcVar8->_M_value + 0x18) >> 0x10,0);
          pcVar9 = TPZFMatrix<std::complex<long_double>_>::operator()
                             (result,(lVar13 - (lVar17 >> 5)) + 1,col);
          pcVar8 = (this->fElem).fStore[lVar13];
          lVar21 = in_ST0;
          in_ST0 = in_ST1;
          in_ST1 = in_ST2;
          in_ST2 = in_ST3;
          in_ST3 = in_ST4;
          in_ST4 = in_ST5;
          pcVar10 = (complex<long_double> *)(lVar17 + (long)pcVar8);
          while (pcVar6 = pcVar10 + -1, pcVar8 < pcVar6) {
            uVar4 = *(undefined8 *)pcVar6->_M_value;
            __r._M_value._16_8_ = *(undefined8 *)(pcVar10[-1]._M_value + 0x10);
            __r._M_value._24_2_ = SUB82(*(undefined8 *)(pcVar10[-1]._M_value + 0x18),0);
            __r._M_value._26_6_ =
                 SUB86((ulong)*(undefined8 *)(pcVar10[-1]._M_value + 0x18) >> 0x10,0);
            __r._M_value._0_4_ = SUB84(uVar4,0);
            __r._M_value._4_2_ = SUB82((ulong)uVar4 >> 0x20,0);
            __r._M_value._6_2_ = SUB82((ulong)uVar4 >> 0x30,0);
            __r._M_value._8_2_ = SUB82(*(undefined8 *)(pcVar10[-1]._M_value + 8),0);
            __r._M_value._10_6_ = SUB86((ulong)*(undefined8 *)(pcVar10[-1]._M_value + 8) >> 0x10,0);
            std::complex<long_double>::operator*=(&__r,pcVar9);
            lVar22 = (longdouble)CONCAT28(val._M_value._8_2_,val._M_value._0_8_) -
                     (longdouble)
                     CONCAT28(__r._M_value._8_2_,
                              CONCAT26(__r._M_value._6_2_,
                                       CONCAT24(__r._M_value._4_2_,__r._M_value._0_4_)));
            lVar20 = (longdouble)CONCAT28(val._M_value._24_2_,val._M_value._16_8_) -
                     (longdouble)CONCAT28(__r._M_value._24_2_,__r._M_value._16_8_);
            val._M_value._0_8_ = SUB108(lVar22,0);
            val._M_value._8_2_ = SUB102((unkuint10)lVar22 >> 0x40,0);
            val._M_value._16_8_ = SUB108(lVar20,0);
            val._M_value._24_2_ = SUB102((unkuint10)lVar20 >> 0x40,0);
            pcVar9 = pcVar9 + 1;
            in_ST4 = in_ST3;
            pcVar10 = pcVar6;
          }
          __r._M_value._16_8_ = val._M_value._16_8_;
          __r._M_value._24_2_ = val._M_value._24_2_;
          __r._M_value._26_6_ = val._M_value._26_6_;
          __r._M_value._0_4_ = val._M_value._0_4_;
          __r._M_value._4_2_ = val._M_value._4_2_;
          __r._M_value._6_2_ = val._M_value._6_2_;
          __r._M_value._8_2_ = val._M_value._8_2_;
          __r._M_value._10_6_ = val._M_value._10_6_;
          pcVar8 = &val;
          std::complex<long_double>::operator*=(&__r,&val);
          std::abs<long_double>((longdouble *)&__r,pcVar8);
          local_108 = (double)(lVar21 + (longdouble)local_108);
          __r_3._M_value._10_6_ = val._M_value._10_6_;
          __r_3._M_value._8_2_ = val._M_value._8_2_;
          __r_3._M_value._26_6_ = val._M_value._26_6_;
          __r_3._M_value._24_2_ = val._M_value._24_2_;
          __r_3._M_value._16_8_ = val._M_value._16_8_;
          __r_3._M_value._0_8_ = val._M_value._0_8_;
          std::complex<long_double>::operator*=(&__r_3,&over);
          __r._M_value._0_4_ = __r_3._M_value._0_4_;
          __r._M_value._4_2_ = __r_3._M_value._4_2_;
          __r._M_value._6_2_ = __r_3._M_value._6_2_;
          __r._M_value._8_2_ = __r_3._M_value._8_2_;
          __r._M_value._10_6_ = __r_3._M_value._10_6_;
          __r._M_value._16_8_ = __r_3._M_value._16_8_;
          __r._M_value._24_2_ = __r_3._M_value._24_2_;
          __r._M_value._26_6_ = __r_3._M_value._26_6_;
          std::complex<long_double>::operator/=(&__r,pcVar6);
          pcVar8 = TPZFMatrix<std::complex<long_double>_>::operator()(result,lVar13,col);
          lVar21 = *(longdouble *)(pcVar8->_M_value + 0x10);
          *(longdouble *)pcVar8->_M_value =
               *(longdouble *)pcVar8->_M_value +
               (longdouble)
               CONCAT28(__r._M_value._8_2_,
                        CONCAT26(__r._M_value._6_2_,CONCAT24(__r._M_value._4_2_,__r._M_value._0_4_))
                       );
          *(longdouble *)(pcVar8->_M_value + 0x10) =
               lVar21 + (longdouble)CONCAT28(__r._M_value._24_2_,__r._M_value._16_8_);
          in_ST5 = in_ST4;
        }
      }
      else {
        for (; lVar13 = lVar15, lVar17 != lVar11; lVar17 = lVar17 + lVar1) {
          ppcVar3 = (this->fElem).fStore;
          lVar13 = (long)ppcVar3[lVar17 + 1] - (long)ppcVar3[lVar17];
          pcVar8 = TPZFMatrix<std::complex<long_double>_>::operator()(scratch,lVar17,col);
          local_120 = *(longdouble *)pcVar8->_M_value;
          __r._M_value._0_4_ = *(undefined4 *)(pcVar8->_M_value + 10);
          __r._M_value._4_2_ = *(undefined2 *)(pcVar8->_M_value + 0xe);
          local_188 = *(longdouble *)(pcVar8->_M_value + 0x10);
          __r_3._M_value._4_2_ = *(undefined2 *)(pcVar8->_M_value + 0x1e);
          __r_3._M_value._0_4_ = *(undefined4 *)(pcVar8->_M_value + 0x1a);
          pcVar9 = TPZFMatrix<std::complex<long_double>_>::operator()
                             (result,(lVar17 - (lVar13 >> 5)) + 1,col);
          pcVar8 = (this->fElem).fStore[lVar17];
          pcVar10 = (complex<long_double> *)(lVar13 + (long)pcVar8);
          while (pcVar6 = pcVar10 + -1, pcVar8 < pcVar6) {
            val._M_value._0_8_ = *(undefined8 *)pcVar6->_M_value;
            val._M_value._16_8_ = *(undefined8 *)(pcVar10[-1]._M_value + 0x10);
            val._M_value._24_2_ = SUB82(*(undefined8 *)(pcVar10[-1]._M_value + 0x18),0);
            val._M_value._26_6_ =
                 SUB86((ulong)*(undefined8 *)(pcVar10[-1]._M_value + 0x18) >> 0x10,0);
            val._M_value._8_2_ = SUB82(*(undefined8 *)(pcVar10[-1]._M_value + 8),0);
            val._M_value._10_6_ = SUB86((ulong)*(undefined8 *)(pcVar10[-1]._M_value + 8) >> 0x10,0);
            std::complex<long_double>::operator*=(&val,pcVar9);
            local_120 = local_120 - (longdouble)CONCAT28(val._M_value._8_2_,val._M_value._0_8_);
            local_188 = local_188 - (longdouble)CONCAT28(val._M_value._24_2_,val._M_value._16_8_);
            pcVar9 = pcVar9 + 1;
            in_ST5 = in_ST4;
            pcVar10 = pcVar6;
          }
          pcVar8 = TPZFMatrix<std::complex<long_double>_>::operator()(scratch,lVar17,col);
          *(longdouble *)pcVar8->_M_value = local_120;
          *(undefined4 *)(pcVar8->_M_value + 10) = __r._M_value._0_4_;
          *(undefined2 *)(pcVar8->_M_value + 0xe) = __r._M_value._4_2_;
          *(longdouble *)(pcVar8->_M_value + 0x10) = local_188;
          *(undefined4 *)(pcVar8->_M_value + 0x1a) = __r_3._M_value._0_4_;
          *(undefined2 *)(pcVar8->_M_value + 0x1e) = __r_3._M_value._4_2_;
        }
        for (; lVar13 != lVar11; lVar13 = lVar13 + lVar1) {
          ppcVar3 = (this->fElem).fStore;
          pcVar8 = ppcVar3[lVar13];
          lVar17 = (long)ppcVar3[lVar13 + 1] - (long)pcVar8;
          pcVar10 = TPZFMatrix<std::complex<long_double>_>::operator()
                              (scratch,(lVar13 - (lVar17 >> 5)) + 1,col);
          pcVar9 = TPZFMatrix<std::complex<long_double>_>::operator()(scratch,lVar13,col);
          val._M_value._0_8_ = *(undefined8 *)pcVar9->_M_value;
          val._M_value._16_8_ = *(undefined8 *)(pcVar9->_M_value + 0x10);
          val._M_value._8_2_ = SUB82(*(undefined8 *)(pcVar9->_M_value + 8),0);
          val._M_value._10_6_ = SUB86((ulong)*(undefined8 *)(pcVar9->_M_value + 8) >> 0x10,0);
          val._M_value._24_2_ = SUB82(*(undefined8 *)(pcVar9->_M_value + 0x18),0);
          val._M_value._26_6_ = SUB86((ulong)*(undefined8 *)(pcVar9->_M_value + 0x18) >> 0x10,0);
          pcVar9 = TPZFMatrix<std::complex<long_double>_>::operator()(result,lVar13,col);
          uVar4 = *(undefined8 *)pcVar8->_M_value;
          __r._M_value._16_8_ = *(undefined8 *)(pcVar8->_M_value + 0x10);
          __r._M_value._0_4_ = SUB84(uVar4,0);
          __r._M_value._4_2_ = SUB82((ulong)uVar4 >> 0x20,0);
          __r._M_value._6_2_ = SUB82((ulong)uVar4 >> 0x30,0);
          __r._M_value._8_2_ = SUB82(*(undefined8 *)(pcVar8->_M_value + 8),0);
          __r._M_value._10_6_ = SUB86((ulong)*(undefined8 *)(pcVar8->_M_value + 8) >> 0x10,0);
          __r._M_value._24_2_ = SUB82(*(undefined8 *)(pcVar8->_M_value + 0x18),0);
          __r._M_value._26_6_ = SUB86((ulong)*(undefined8 *)(pcVar8->_M_value + 0x18) >> 0x10,0);
          std::complex<long_double>::operator*=(&__r,pcVar9);
          lVar20 = (longdouble)CONCAT28(val._M_value._8_2_,val._M_value._0_8_) -
                   (longdouble)
                   CONCAT28(__r._M_value._8_2_,
                            CONCAT26(__r._M_value._6_2_,
                                     CONCAT24(__r._M_value._4_2_,__r._M_value._0_4_)));
          lVar21 = (longdouble)CONCAT28(val._M_value._24_2_,val._M_value._16_8_) -
                   (longdouble)CONCAT28(__r._M_value._24_2_,__r._M_value._16_8_);
          val._M_value._0_8_ = SUB108(lVar20,0);
          val._M_value._8_2_ = SUB102((unkuint10)lVar20 >> 0x40,0);
          val._M_value._16_8_ = SUB108(lVar21,0);
          val._M_value._24_2_ = SUB102((unkuint10)lVar21 >> 0x40,0);
          __r._M_value._16_8_ = val._M_value._16_8_;
          __r._M_value._24_2_ = val._M_value._24_2_;
          __r._M_value._26_6_ = val._M_value._26_6_;
          __r._M_value._0_4_ = SUB104(lVar20,0);
          __r._M_value._4_2_ = SUB102((unkuint10)lVar20 >> 0x20,0);
          __r._M_value._6_2_ = SUB102((unkuint10)lVar20 >> 0x30,0);
          __r._M_value._8_2_ = val._M_value._8_2_;
          __r._M_value._10_6_ = val._M_value._10_6_;
          pcVar9 = &val;
          lVar20 = in_ST4;
          std::complex<long_double>::operator*=(&__r,&val);
          std::abs<long_double>((longdouble *)&__r,pcVar9);
          lVar22 = in_ST0 + (longdouble)local_108;
          __r_3._M_value._10_6_ = over._M_value._10_6_;
          __r_3._M_value._8_2_ = over._M_value._8_2_;
          __r_3._M_value._26_6_ = over._M_value._26_6_;
          __r_3._M_value._24_2_ = over._M_value._24_2_;
          __r_3._M_value._16_8_ = over._M_value._16_8_;
          __r_3._M_value._0_8_ = over._M_value._0_8_;
          std::complex<long_double>::operator*=(&__r_3,&val);
          __r._M_value._0_4_ = __r_3._M_value._0_4_;
          __r._M_value._4_2_ = __r_3._M_value._4_2_;
          __r._M_value._6_2_ = __r_3._M_value._6_2_;
          __r._M_value._8_2_ = __r_3._M_value._8_2_;
          __r._M_value._10_6_ = __r_3._M_value._10_6_;
          __r._M_value._16_8_ = __r_3._M_value._16_8_;
          __r._M_value._24_2_ = __r_3._M_value._24_2_;
          __r._M_value._26_6_ = __r_3._M_value._26_6_;
          std::complex<long_double>::operator/=(&__r,pcVar8);
          val._M_value._4_2_ = __r._M_value._4_2_;
          val._M_value._0_4_ = __r._M_value._0_4_;
          val._M_value._6_2_ = __r._M_value._6_2_;
          val._M_value._8_2_ = __r._M_value._8_2_;
          val._M_value._10_6_ = __r._M_value._10_6_;
          val._M_value._16_8_ = __r._M_value._16_8_;
          val._M_value._24_2_ = __r._M_value._24_2_;
          val._M_value._26_6_ = __r._M_value._26_6_;
          pcVar9 = TPZFMatrix<std::complex<long_double>_>::operator()(result,lVar13,col);
          lVar21 = *(longdouble *)(pcVar9->_M_value + 0x10);
          *(longdouble *)pcVar9->_M_value =
               *(longdouble *)pcVar9->_M_value +
               (longdouble)CONCAT28(val._M_value._8_2_,val._M_value._0_8_);
          *(longdouble *)(pcVar9->_M_value + 0x10) =
               lVar21 + (longdouble)CONCAT28(val._M_value._24_2_,val._M_value._16_8_);
          in_ST5 = lVar20;
          pcVar9 = TPZFMatrix<std::complex<long_double>_>::operator()(result,lVar13,col);
          val._M_value._0_8_ = *(undefined8 *)pcVar9->_M_value;
          val._M_value._16_8_ = *(undefined8 *)(pcVar9->_M_value + 0x10);
          val._M_value._24_2_ = SUB82(*(undefined8 *)(pcVar9->_M_value + 0x18),0);
          val._M_value._26_6_ = SUB86((ulong)*(undefined8 *)(pcVar9->_M_value + 0x18) >> 0x10,0);
          val._M_value._8_2_ = SUB82(*(undefined8 *)(pcVar9->_M_value + 8),0);
          val._M_value._10_6_ = SUB86((ulong)*(undefined8 *)(pcVar9->_M_value + 8) >> 0x10,0);
          in_ST0 = in_ST1;
          in_ST1 = in_ST2;
          in_ST2 = in_ST3;
          in_ST3 = in_ST4;
          in_ST4 = lVar20;
          pcVar9 = (complex<long_double> *)((long)(this->fElem).fStore[lVar13] + lVar17);
          while (pcVar6 = pcVar9 + -1, pcVar8 < pcVar6) {
            uVar4 = *(undefined8 *)pcVar6->_M_value;
            __r._M_value._16_8_ = *(undefined8 *)(pcVar9[-1]._M_value + 0x10);
            __r._M_value._24_2_ = SUB82(*(undefined8 *)(pcVar9[-1]._M_value + 0x18),0);
            __r._M_value._26_6_ =
                 SUB86((ulong)*(undefined8 *)(pcVar9[-1]._M_value + 0x18) >> 0x10,0);
            __r._M_value._0_4_ = SUB84(uVar4,0);
            __r._M_value._4_2_ = SUB82((ulong)uVar4 >> 0x20,0);
            __r._M_value._6_2_ = SUB82((ulong)uVar4 >> 0x30,0);
            __r._M_value._8_2_ = SUB82(*(undefined8 *)(pcVar9[-1]._M_value + 8),0);
            __r._M_value._10_6_ = SUB86((ulong)*(undefined8 *)(pcVar9[-1]._M_value + 8) >> 0x10,0);
            std::complex<long_double>::operator*=(&__r,&val);
            lVar21 = *(longdouble *)(pcVar10->_M_value + 0x10);
            *(longdouble *)pcVar10->_M_value =
                 *(longdouble *)pcVar10->_M_value -
                 (longdouble)
                 CONCAT28(__r._M_value._8_2_,
                          CONCAT26(__r._M_value._6_2_,
                                   CONCAT24(__r._M_value._4_2_,__r._M_value._0_4_)));
            *(longdouble *)(pcVar10->_M_value + 0x10) =
                 lVar21 - (longdouble)CONCAT28(__r._M_value._24_2_,__r._M_value._16_8_);
            pcVar10 = pcVar10 + 1;
            in_ST5 = in_ST4;
            pcVar9 = pcVar6;
          }
          local_108 = (double)lVar22;
        }
      }
      uVar23 = SUB84(local_108,0);
      uVar24 = (undefined4)((ulong)local_108 >> 0x20);
    }
    if ((double)CONCAT44(uVar24,uVar23) < 0.0) {
      dVar2 = sqrt((double)CONCAT44(uVar24,uVar23));
    }
    else {
      dVar2 = SQRT((double)CONCAT44(uVar24,uVar23));
    }
    lVar12 = lVar12 + 1;
  }
  if (residual != (TPZFMatrix<std::complex<long_double>_> *)0x0) {
    (*(this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0x28])(this,result,F);
  }
  *numiterations = lVar12;
  *tol = dVar2;
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::SolveSOR(int64_t & numiterations,const TPZFMatrix<TVar> &F,
                                   TPZFMatrix<TVar> &result, TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &scratch,const REAL overrelax,
                                   REAL &tol,const int FromCurrent,const int direction)  {
	
	if(residual == &F) {
		cout << "TPZMatrix::SolveSOR called with residual and F equal, no solution\n";
		return;
	}
	REAL res = 2.*tol+1.;
	if(residual) res = Norm(*residual);
	if(!FromCurrent) {
		result.Zero();
	}
    TVar over = overrelax;
	int64_t r = this->Dim();
	int64_t c = F.Cols();
	int64_t i,ifirst = 0, ilast = r, iinc = 1;
	if(direction == -1) {
		ifirst = r-1;
		ilast = 0;
		iinc = -1;
	}
	int64_t it;
	for(it=0; it<numiterations && res > tol; it++) {
		res = 0.;
		scratch = F;
		for(int64_t ic=0; ic<c; ic++) {
			if(direction == 1) {
				//
				// compute the upper triangular part first and put into the scractch vector
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					TVar val;
					TVar *diag;
					TVar *diaglast = fElem[i];
					TVar *scratchp = &scratch(i-offset+1,ic);
					val = result(i,ic);
					diag = fElem[i] + offset-1;
					int64_t lastid = diag-diaglast;
					int64_t id;
					for(id=0; id<=lastid; id++) *(scratchp+id) -= *(diag-id) * val;
					/* codeguard fix
					 while( diag >= diaglast ) *scratchp++ -= *diag-- * val;
					 */
				}
				//
				// perform the SOR operation
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					TVar val = scratch(i,ic);
					TVar *p = &result(i-offset+1,ic);
					TVar *diag = fElem[i] + offset-1;
					TVar *diaglast = fElem[i];
					while( diag > diaglast ) val -= *diag-- * *p++;
					res += abs(val*val);
					result(i,ic) += val*over/ (*diag);
				}
			} else {
				//
				// the direction is upward
				//
				// put the lower triangular part of the multiplication into the scratch vector
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					TVar val = scratch(i,ic);
					TVar *p = &result(i-offset+1,ic);
					TVar *diag = fElem[i] + offset-1;
					TVar *diaglast = fElem[i];
					while( diag > diaglast ) val -= *diag-- * *p++;
					//					res += val*val;
					scratch(i,ic) = val;
				}
				//
				// perform the SOR operation
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					//	TVar val = scratch(i,ic);
					TVar *diag;
					TVar *diaglast = fElem[i];
					TVar *scratchp = &scratch(i-offset+1,ic);
					//val= result(i,ic);
					TVar val = scratch(i,ic);
					val -= *diaglast * result(i,ic);
					res += abs(val*val);
					val = over * val / *diaglast;
					result(i,ic) += val;
					val = result(i,ic);
					diag = fElem[i] + offset-1;
					while( diag > diaglast ) *scratchp++ -= *diag-- * val;
				}
			}
		}
		res = sqrt(res);
	}
	if(residual) {
		this->Residual(result,F,*residual);
	}
	numiterations = it;
	tol = res;
}